

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O3

void __thiscall
QSslCertificate::QSslCertificate(QSslCertificate *this,QByteArray *data,EncodingFormat format)

{
  QSslCertificatePrivate *this_00;
  QTlsBackend *pQVar1;
  code *pcVar2;
  QLoggingCategory *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCertificatePrivate *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(this_00);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  if ((data->d).size != 0) {
    pQVar1 = QTlsBackend::activeOrAnyBackend();
    if (pQVar1 != (QTlsBackend *)0x0) {
      pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe8 + (ulong)(format != Pem) * 8))(pQVar1);
      if (pcVar2 == (code *)0x0) {
        this_01 = QtPrivateLogging::lcSsl();
        if (((this_01->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          QSslCertificate((QSslCertificate *)this_01);
        }
      }
      else {
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d._0_4_ = 0xaaaaaaaa;
        local_48.d._4_4_ = 0xaaaaaaaa;
        local_48.ptr._0_4_ = 0xaaaaaaaa;
        local_48.ptr._4_4_ = 0xaaaaaaaa;
        (*pcVar2)(&local_48,data,1);
        if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
          QExplicitlySharedDataPointer<QSslCertificatePrivate>::reset
                    (&this->d,*(QSslCertificatePrivate **)
                               CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_));
        }
        QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate::QSslCertificate(const QByteArray &data, QSsl::EncodingFormat format)
    : d(new QSslCertificatePrivate)
{
    if (data.isEmpty())
        return;

    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend)
        return;

    auto *X509Reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
    if (!X509Reader) {
        qCWarning(lcSsl, "Current TLS plugin does not support reading from PEM/DER");
        return;
    }

    const QList<QSslCertificate> certs = X509Reader(data, 1);
    if (!certs.isEmpty())
        d = certs.first().d;
}